

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O3

void __thiscall
deqp::ShaderSwitchCase::ShaderSwitchCase
          (ShaderSwitchCase *this,Context *context,char *name,char *description,bool isVertexCase,
          char *vtxSource,char *fragSource,ShaderEvalFunc evalFunc)

{
  char *pcVar1;
  
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderSwitchCase_0210c060;
  pcVar1 = (char *)(this->super_ShaderRenderCase).m_vertShaderSource._M_string_length;
  strlen(vtxSource);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_vertShaderSource,0,pcVar1,(ulong)vtxSource);
  pcVar1 = (char *)(this->super_ShaderRenderCase).m_fragShaderSource._M_string_length;
  strlen(fragSource);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderRenderCase).m_fragShaderSource,0,pcVar1,(ulong)fragSource);
  return;
}

Assistant:

ShaderSwitchCase::ShaderSwitchCase(Context& context, const char* name, const char* description, bool isVertexCase,
								   const char* vtxSource, const char* fragSource, ShaderEvalFunc evalFunc)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name,
					   description, isVertexCase, evalFunc)
{
	m_vertShaderSource = vtxSource;
	m_fragShaderSource = fragSource;
}